

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  RunProgramm *this;
  string local_40;
  allocator local_19;
  
  this = (RunProgramm *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_40,argv[1],&local_19);
  RunProgramm::RunProgramm(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  RunProgramm::run(this);
  RunProgramm::~RunProgramm(this);
  operator_delete(this,0x30);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void) argc;
  RunProgramm *programm = new RunProgramm(argv[FILE_NAME_ARG_INDEX]);
  programm->run();
  delete (programm);
  return 0;
}